

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<unsigned_int,unsigned_long>
               (unsigned_long *key,int len,int maxlen,unsigned_long *blocks,int blockcount,
               pfHash hash,vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  iterator __position;
  ulong uVar1;
  uint h;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  long local_38;
  
  if (0 < blockcount && len != maxlen) {
    local_38 = (long)len;
    local_4c = len + 1;
    uVar1 = 0;
    local_48 = len * 8 + 8;
    local_40 = (ulong)(uint)blockcount;
    local_44 = maxlen;
    do {
      key[local_38] = blocks[uVar1];
      (*hash)(key,local_48,0,&local_50);
      __position._M_current =
           (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)hashes,__position,&local_50)
        ;
      }
      else {
        *__position._M_current = local_50;
        (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      CombinationKeygenRecurse<unsigned_int,unsigned_long>
                (key,local_4c,local_44,blocks,blockcount,hash,hashes);
      uVar1 = uVar1 + 1;
    } while (local_40 != uVar1);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}